

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-properties.c
# Opt level: O1

wchar_t object_value_real(object *obj,wchar_t qty)

{
  obj_property *poVar1;
  byte bVar2;
  wchar_t wVar3;
  char *pcVar4;
  _Bool *p_Var5;
  object_kind *poVar6;
  _Bool _Var7;
  _Bool _Var8;
  int iVar9;
  wchar_t wVar10;
  int iVar11;
  obj_property *poVar12;
  char *pcVar13;
  char *pcVar14;
  wchar_t *pwVar15;
  int iVar16;
  wchar_t wVar17;
  ulong uVar18;
  char **ppcVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  bool bVar23;
  wchar_t local_64;
  
  _Var7 = tval_has_variable_power(obj);
  if (_Var7) {
    local_64 = obj->kind->cost;
    if (1 < z_info->property_max) {
      uVar18 = 1;
      do {
        if (7 < (uint)(obj_properties[uVar18].type + L'\xffffffff')) goto switchD_001ad204_default;
        poVar1 = obj_properties + uVar18;
        wVar10 = obj_properties[uVar18].index;
        switch(obj_properties[uVar18].type) {
        default:
          bVar23 = obj->modifiers[wVar10] == 0;
          goto LAB_001ad1d6;
        case L'\x03':
          bVar23 = flag_has_dbg(obj->flags,6,wVar10,"obj->flags","idx");
          break;
        case L'\x04':
          bVar23 = obj->el_info[wVar10].res_level == 100;
LAB_001ad1d6:
          bVar23 = !bVar23;
          break;
        case L'\x05':
          bVar23 = (bool)((obj->el_info[wVar10].flags & 2) >> 1);
          break;
        case L'\x06':
          p_Var5 = obj->brands;
          if ((p_Var5 != (_Bool *)0x0) && (bVar2 = z_info->brand_max, 1 < (ulong)bVar2)) {
            uVar22 = 1;
            do {
              if ((p_Var5[uVar22] == true) &&
                 (poVar12 = brand_property((wchar_t)uVar22), poVar12 == poVar1)) goto LAB_001ad1e1;
              uVar22 = uVar22 + 1;
            } while (bVar2 != uVar22);
          }
          goto switchD_001ad204_default;
        case L'\a':
          if ((obj->slays != (_Bool *)0x0) && (bVar2 = z_info->slay_max, 1 < bVar2)) {
            wVar17 = L'\x01';
            do {
              poVar12 = slay_property(wVar17);
              bVar23 = poVar12 == poVar1;
              if (bVar23) break;
              iVar11 = (2 - (uint)bVar2) + wVar17;
              wVar17 = wVar17 + L'\x01';
            } while (iVar11 != 1);
            break;
          }
          goto switchD_001ad204_default;
        case L'\b':
          pcVar4 = poVar1->name;
          iVar11 = strcmp(pcVar4,"enhanced dice");
          if (iVar11 != 0) {
            iVar11 = strcmp(pcVar4,"extra armor");
            if (iVar11 == 0) {
              wVar17 = obj->kind->ac;
              bVar23 = SBORROW4(wVar17,(int)obj->ac);
              iVar11 = wVar17 - obj->ac;
              goto LAB_001ad70a;
            }
            iVar11 = strcmp(pcVar4,"armor bonus");
            if (iVar11 == 0) {
              bVar23 = obj->to_a == 0;
            }
            else {
              iVar11 = strcmp(pcVar4,"skill bonus");
              if (iVar11 == 0) {
                bVar23 = obj->to_h == 0;
              }
              else {
                iVar11 = strcmp(pcVar4,"deadliness bonus");
                if (iVar11 != 0) goto switchD_001ad204_default;
                bVar23 = obj->to_d == 0;
              }
            }
            goto LAB_001ad1d6;
          }
          if ((int)(uint)obj->dd <= obj->kind->dd) {
            wVar17 = obj->kind->ds;
            bVar23 = SBORROW4(wVar17,(uint)obj->ds);
            iVar11 = wVar17 - (uint)obj->ds;
LAB_001ad70a:
            bVar23 = bVar23 != iVar11 < 0;
            break;
          }
          goto LAB_001ad1e1;
        }
        if (bVar23 != false) {
LAB_001ad1e1:
          switch(poVar1->type) {
          case L'\x01':
          case L'\x02':
            iVar9 = (int)obj->modifiers[wVar10];
            iVar11 = -iVar9;
            if (0 < iVar9) {
              iVar11 = iVar9;
            }
            local_64 = local_64 + poVar1->price_constant +
                       (iVar11 * poVar1->price_square + poVar1->price_linear) * iVar9;
            break;
          case L'\x03':
          case L'\x05':
            local_64 = local_64 + poVar1->price_constant;
            break;
          case L'\x04':
            iVar9 = 100 - obj->el_info[wVar10].res_level;
            iVar11 = -iVar9;
            if (0 < iVar9) {
              iVar11 = iVar9;
            }
            local_64 = local_64 + poVar1->price_constant +
                       (iVar11 * poVar1->price_square + poVar1->price_linear) * iVar9;
            break;
          case L'\x06':
            if (z_info->brand_max != '\0') {
              lVar20 = 0x20;
              uVar22 = 0;
              do {
                if ((obj->brands[uVar22] == true) &&
                   (poVar12 = brand_property((wchar_t)uVar22), poVar1 == poVar12)) {
                  iVar11 = *(int *)((long)&brands->code + lVar20);
                  _Var7 = tval_is_ammo(obj);
                  iVar9 = -iVar11;
                  if (0 < iVar11) {
                    iVar9 = iVar11;
                  }
                  iVar11 = ((iVar9 * poVar1->price_square + poVar1->price_linear) * iVar11 +
                           poVar1->price_constant) / (int)((uint)_Var7 * 9 + 1);
                  _Var8 = tval_is_melee_weapon(obj);
                  if (_Var7 || _Var8) {
                    iVar11 = (int)(iVar11 * (uint)obj->ds * (obj->dd + 1)) / 0x18;
                  }
                  local_64 = local_64 + iVar11;
                }
                uVar22 = uVar22 + 1;
                lVar20 = lVar20 + 0x30;
              } while (uVar22 < z_info->brand_max);
            }
            break;
          case L'\a':
            if (z_info->slay_max != '\0') {
              uVar22 = 0;
              do {
                if ((obj->slays[uVar22] == true) &&
                   (poVar12 = slay_property((wchar_t)uVar22), poVar1 == poVar12)) {
                  iVar11 = slays[uVar22].multiplier;
                  _Var7 = tval_is_ammo(obj);
                  iVar9 = -iVar11;
                  if (0 < iVar11) {
                    iVar9 = iVar11;
                  }
                  iVar11 = ((iVar9 * poVar1->price_square + poVar1->price_linear) * iVar11 +
                           poVar1->price_constant) / (int)((uint)_Var7 + (uint)_Var7 * 8 + 1);
                  _Var8 = tval_is_melee_weapon(obj);
                  if (_Var7 || _Var8) {
                    iVar11 = (int)(iVar11 * (uint)obj->ds * (obj->dd + 1)) / 0x18;
                  }
                  p_Var5 = obj->brands;
                  if (p_Var5 != (_Bool *)0x0) {
                    pcVar4 = poVar1->name;
                    iVar9 = strcmp(pcVar4,"slay evil creatures");
                    if ((iVar9 != 0) && (bVar2 = z_info->brand_max, 1 < (ulong)bVar2)) {
                      ppcVar19 = &brands[1].name;
                      uVar21 = 1;
                      do {
                        if (p_Var5[uVar21] == true) {
                          pcVar14 = *ppcVar19;
                          pcVar13 = strstr(pcVar14,"poison brand");
                          if ((pcVar13 == (char *)0x0) &&
                             ((pcVar14 = strstr(pcVar14,"cold brand"), pcVar14 == (char *)0x0 ||
                              (iVar9 = strcmp(pcVar4,"slay undead"), iVar9 != 0)))) {
                            iVar9 = iVar11 + 3;
                            if (-1 < iVar11) {
                              iVar9 = iVar11;
                            }
                            iVar11 = iVar11 - (iVar9 >> 2);
                            break;
                          }
                        }
                        uVar21 = uVar21 + 1;
                        ppcVar19 = ppcVar19 + 6;
                      } while (bVar2 != uVar21);
                    }
                  }
                  local_64 = local_64 + iVar11;
                }
                uVar22 = uVar22 + 1;
              } while (uVar22 < z_info->slay_max);
            }
            break;
          case L'\b':
            poVar6 = obj->kind;
            pcVar4 = poVar1->name;
            iVar11 = strcmp(pcVar4,"enhanced dice");
            if (iVar11 == 0) {
              iVar11 = (uint)obj->dd * ((uint)obj->ds - poVar6->ds);
              local_64 = local_64 + iVar11 * iVar11 * 0x10;
            }
            else {
              iVar11 = strcmp(pcVar4,"extra armor");
              if (iVar11 == 0) {
                iVar11 = (int)obj->ac - poVar6->ac;
              }
              else {
                iVar11 = strcmp(pcVar4,"armor bonus");
                if (iVar11 != 0) {
                  iVar11 = strcmp(pcVar4,"skill bonus");
                  if (iVar11 == 0) {
                    iVar11 = (int)obj->to_h - (poVar6->to_h).base;
                  }
                  else {
                    iVar11 = strcmp(pcVar4,"deadliness bonus");
                    if (iVar11 != 0) break;
                    iVar11 = (int)obj->to_d;
                  }
                  iVar9 = -iVar11;
                  if (0 < iVar11) {
                    iVar9 = iVar11;
                  }
                  wVar10 = poVar1->price_square;
                  wVar17 = poVar1->price_linear;
                  wVar3 = poVar1->price_constant;
                  _Var7 = tval_is_ammo(obj);
                  iVar16 = 1;
                  if (_Var7) {
                    iVar16 = 0x14;
                  }
                  local_64 = local_64 + ((iVar9 * wVar10 + wVar17) * iVar11 + wVar3) / iVar16;
                  break;
                }
                iVar11 = (int)obj->to_a;
              }
              iVar9 = -iVar11;
              if (0 < iVar11) {
                iVar9 = iVar11;
              }
              local_64 = local_64 + poVar1->price_constant +
                         (iVar9 * poVar1->price_square + poVar1->price_linear) * iVar11;
            }
          }
        }
switchD_001ad204_default:
        uVar18 = uVar18 + 1;
      } while (uVar18 < z_info->property_max);
    }
    if ((obj->curses != (curse_data *)0x0) && (z_info->curse_max != '\0')) {
      lVar20 = 3;
      uVar18 = 0;
      do {
        if (obj->curses[uVar18].power != L'\0') {
          wVar10 = object_value_real(*(object **)(curses->conflict_flags + lVar20 * 8 + -0x28),
                                     L'\x01');
          local_64 = local_64 + wVar10;
        }
        uVar18 = uVar18 + 1;
        lVar20 = lVar20 + 7;
      } while (uVar18 < z_info->curse_max);
    }
  }
  else {
    if (obj->artifact == (artifact *)0x0) {
      pwVar15 = &obj->kind->cost;
    }
    else {
      pwVar15 = &obj->artifact->cost;
    }
    wVar10 = *pwVar15;
    if (wVar10 == L'\0') {
      local_64 = L'\0';
    }
    else {
      wVar17 = wVar10 * qty;
      _Var7 = tval_can_have_charges(obj);
      if (_Var7) {
        iVar11 = obj->pval * qty;
        wVar17 = (((iVar11 / (int)(uint)obj->number + 1) -
                  (uint)(iVar11 % (int)(uint)obj->number == 0)) * wVar10) / 0x14 + wVar17;
      }
      local_64 = L'\0';
      if (L'\0' < wVar17) {
        local_64 = wVar17;
      }
    }
  }
  return local_64;
}

Assistant:

int object_value_real(const struct object *obj, int qty)
{
	int value, total_value = 0;

	/* Wearables and ammo have prices that vary by individual item properties */
	if (tval_has_variable_power(obj)) {
		int i, j;

		/* Base cost */
		value = obj->kind->cost;

		/* Add/subtract value for properties */
		for (i = 1; i < z_info->property_max; i++) {
			struct obj_property *prop =	&obj_properties[i];
			int idx = prop->index;
			if (!object_has_property(obj, prop)) continue;
			switch (prop->type) {
				case OBJ_PROPERTY_STAT :
				case OBJ_PROPERTY_MOD :
				{
					value += property_cost(prop, obj->modifiers[idx], true);
					break;
				}
				case OBJ_PROPERTY_FLAG :
				{
					value += property_cost(prop, 0, true);
					break;
				}
				case OBJ_PROPERTY_ELEMENT :
				{
					int amount = RES_LEVEL_BASE - obj->el_info[idx].res_level;
					value += property_cost(prop, amount, true);
					break;
				}
				case OBJ_PROPERTY_IGNORE :
				{
					value += property_cost(prop, 0, true);
					break;
				}
				case OBJ_PROPERTY_BRAND :
				{
					for (j = 0; j < z_info->brand_max; j++) {
						if (obj->brands[j] && (prop == brand_property(j))) {
							int mult = brands[j].multiplier;
							int div = tval_is_ammo(obj) ? 10 : 1;
							int32_t bonus = property_cost(prop, mult, true) / div;
							/* Weapons with big dice are just better, so
							 * anything that enhances attacks is worth more on
							 them */
							if ((tval_is_melee_weapon(obj)) || (div == 10))	{
								bonus *= ((obj->dd + 1) * (obj->ds));
								bonus /= 24;
							}
							value += bonus;
						}
					}
					break;
				}
				case OBJ_PROPERTY_SLAY :
				{
					for (j = 0; j < z_info->slay_max; j++) {
						if (obj->slays[j] && (prop == slay_property(j))) {
							int mult = slays[j].multiplier;
							int div = tval_is_ammo(obj) ? 10 : 1;
							int32_t bonus = property_cost(prop, mult, true) / div;
							/* Weapons with big dice are just better, so
							 * anything that enhances attacks is worth more on
							 them */
							if ((tval_is_melee_weapon(obj)) || (div == 10))
							{
								bonus *= ((obj->dd + 1) * (obj->ds));
								bonus /= 24;
							}
							/* Cheap check for brands with broader applicability
							 * that might reduce the slay's practical value */
							if ((obj->brands) &&
								(!streq(prop->name, "slay evil creatures"))) {
								int k;
								bool reduce_bonus = false;
								for (k = 1; k < z_info->brand_max; k++)
								{
									if (!obj->brands[k]) continue;
									if (strstr(brands[k].name, "poison brand"))
										continue;
									if ((strstr(brands[k].name, "cold brand"))
										&& (streq(prop->name, "slay undead")))
										continue;
									reduce_bonus = true;
									break;
								}
								if (reduce_bonus) bonus -= (bonus / 4);
							}
							value += bonus;
						}
					}
					break;
				}
				case OBJ_PROPERTY_COMBAT :
				{
					struct object_kind *kind = obj->kind;
					if (streq(prop->name, "enhanced dice")) {
						value += (obj->ds - kind->ds) * (obj->ds - kind->ds)
							* obj->dd * obj->dd * 16L;
					} else if (streq(prop->name, "extra armor")) {
						value += property_cost(prop, obj->ac - kind->ac, true);
					} else if (streq(prop->name, "armor bonus")) {
						value += property_cost(prop, obj->to_a, true);
					} else if (streq(prop->name, "skill bonus")) {
						value += property_cost(prop, obj->to_h- kind->to_h.base,
											   true) /
							(tval_is_ammo(obj) ? 20 : 1);
					} else if (streq(prop->name, "deadliness bonus")) {
						value += property_cost(prop, obj->to_d, true) /
							(tval_is_ammo(obj) ? 20 : 1);
					}
					break;
				}
				default : break;
			}
		}

		/* Amend cost for curses */
		if (obj->curses) {
			for (i = 0; i < z_info->curse_max; i++) {
				if (obj->curses[i].power) {
					value += object_value_real(curses[i].obj, 1);
				}
			}
		}

		total_value = value;
	} else {
		/* Base cost */
		if (obj->artifact) {
			value = obj->artifact->cost;
		} else {
			value = obj->kind->cost;
		}

		/* Worthless items */
		if (!value) return (0L);

		/* Account for quantity */
		total_value = value * qty;

		/* Charge-holding devices need special treatment */
		if (tval_can_have_charges(obj)) {
			int charges;

			/* Calculate number of charges, rounded up */
			charges = obj->pval * qty / obj->number;
			if ((obj->pval * qty) % obj->number != 0)
				charges++;

			/* Pay extra for charges, depending on standard number of charges */
			total_value += value * charges / 20;
		}

		/* No negative value */
		if (total_value < 0) total_value = 0;
	}

	/* Return the value */
	return total_value;
}